

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::PopulateIncludeDirectoriesInterface
          (cmExportFileGenerator *this,cmTargetExport *tei,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmTarget *this_00;
  cmMakefile *pcVar2;
  auto_ptr<cmCompiledGeneratorExpression> this_01;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  long lVar7;
  size_t sVar8;
  _Alloc_hider _Var9;
  char *pcVar10;
  string prepro;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  string local_228;
  char *local_208;
  cmExportFileGenerator *local_200;
  string exportDirs;
  string dirs;
  string includes;
  ios_base local_138 [264];
  
  local_200 = this;
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmExportFileGenerator.cxx"
                  ,0x1a8,
                  "void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(cmTargetExport *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, std::vector<std::string> &)"
                 );
  }
  this_00 = tei->Target;
  includes._M_dataplus._M_p = (pointer)&includes.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&includes,"INTERFACE_INCLUDE_DIRECTORIES","");
  local_208 = cmTarget::GetProperty(this_00,&includes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != &includes.field_2) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)0x0);
  cmGeneratorExpression::Preprocess(&dirs,&tei->InterfaceIncludeDirectories,InstallInterface,true);
  (*local_200->_vptr_cmExportFileGenerator[5])(local_200,&dirs);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&includes,(string *)&ge);
  cge.x_ = (cmCompiledGeneratorExpression *)includes._M_dataplus;
  includes._M_dataplus._M_p = (pointer)0x0;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&includes);
  this_01 = cge;
  pcVar2 = this_00->Makefile;
  paVar1 = &includes.field_2;
  includes._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&includes,"");
  prepro._M_dataplus._M_p = (pointer)&prepro.field_2;
  prepro._M_string_length = 0;
  prepro.field_2._M_local_buf[0] = '\0';
  pcVar4 = cmCompiledGeneratorExpression::Evaluate
                     (this_01.x_,pcVar2,&includes,false,this_00,(cmTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&prepro);
  std::__cxx11::string::string((string *)&exportDirs,pcVar4,(allocator *)&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prepro._M_dataplus._M_p != &prepro.field_2) {
    operator_delete(prepro._M_dataplus._M_p,
                    CONCAT71(prepro.field_2._M_allocated_capacity._1_7_,
                             prepro.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != paVar1) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
  if ((cge.x_)->HadContextSensitiveCondition == true) {
    pcVar2 = this_00->Makefile;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includes);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&includes,"Target \"",8);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&includes,(this_00->Name)._M_dataplus._M_p,
                        (this_00->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "\" is installed with INCLUDES DESTINATION set to a context sensitive path.  Paths which depend on the configuration, policy values or the link interface are not supported.  Consider using target_include_directories instead."
               ,0xde);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&prepro);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prepro._M_dataplus._M_p != &prepro.field_2) {
      operator_delete(prepro._M_dataplus._M_p,
                      CONCAT71(prepro.field_2._M_allocated_capacity._1_7_,
                               prepro.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includes);
    std::ios_base::~ios_base(local_138);
    goto LAB_003b3e97;
  }
  if (local_208 == (char *)0x0) {
    if (exportDirs._M_string_length == 0) goto LAB_003b3e97;
LAB_003b3c16:
    includes._M_dataplus._M_p = (pointer)0x0;
    includes._M_string_length = 0;
    includes.field_2._M_allocated_capacity = 0;
    cmGeneratorExpression::Split
              (&exportDirs,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&includes);
    std::__cxx11::string::_M_replace
              ((ulong)&exportDirs,0,(char *)exportDirs._M_string_length,0x53c2a5);
    if (includes._M_dataplus._M_p != (pointer)includes._M_string_length) {
      _Var9 = includes._M_dataplus;
      do {
        std::__cxx11::string::append((char *)&exportDirs);
        bVar3 = cmsys::SystemTools::FileIsFullPath(*(char **)_Var9._M_p);
        if (!bVar3) {
          lVar7 = std::__cxx11::string::find(_Var9._M_p,0x5102d9,0);
          if (lVar7 == -1) {
            std::__cxx11::string::append((char *)&exportDirs);
          }
        }
        std::__cxx11::string::_M_append((char *)&exportDirs,*(ulong *)_Var9._M_p);
        _Var9._M_p = _Var9._M_p + 0x20;
      } while (_Var9._M_p != (pointer)includes._M_string_length);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&includes);
    pcVar4 = local_208;
    pcVar10 = local_208;
    if (local_208 == (char *)0x0) {
      pcVar10 = "";
    }
    includes._M_dataplus._M_p = (pointer)&includes.field_2;
    sVar8 = strlen(pcVar10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&includes,pcVar10,pcVar10 + sVar8);
    pcVar10 = ";";
    if (pcVar4 == (char *)0x0) {
      pcVar10 = "";
    }
    std::operator+(&prepro,pcVar10,&exportDirs);
    std::__cxx11::string::_M_append((char *)&includes,(ulong)prepro._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prepro._M_dataplus._M_p != &prepro.field_2) {
      operator_delete(prepro._M_dataplus._M_p,
                      CONCAT71(prepro.field_2._M_allocated_capacity._1_7_,
                               prepro.field_2._M_local_buf[0]) + 1);
    }
    cmGeneratorExpression::Preprocess(&prepro,&includes,InstallInterface,true);
    if (prepro._M_string_length != 0) {
      ResolveTargetsInGeneratorExpression(local_200,&prepro,this_00,missingTargets);
      paVar1 = &local_228.field_2;
      local_228._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_228,"INTERFACE_INCLUDE_DIRECTORIES","");
      bVar3 = checkInterfaceDirs(&prepro,this_00,&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar1) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._0_8_ + 1);
      }
      if (bVar3) {
        local_228._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_228,"INTERFACE_INCLUDE_DIRECTORIES","");
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&local_228);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar1) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._0_8_ + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prepro._M_dataplus._M_p != &prepro.field_2) {
      operator_delete(prepro._M_dataplus._M_p,
                      CONCAT71(prepro.field_2._M_allocated_capacity._1_7_,
                               prepro.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    if ((*local_208 != '\0') || (exportDirs._M_string_length != 0)) goto LAB_003b3c16;
    includes._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&includes,"INTERFACE_INCLUDE_DIRECTORIES","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&includes);
    std::__cxx11::string::_M_replace((ulong)pmVar6,0,(char *)pmVar6->_M_string_length,0x53c2a5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != &includes.field_2) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
LAB_003b3e97:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exportDirs._M_dataplus._M_p != &exportDirs.field_2) {
    operator_delete(exportDirs._M_dataplus._M_p,exportDirs.field_2._M_allocated_capacity + 1);
  }
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirs._M_dataplus._M_p != &dirs.field_2) {
    operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
  }
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(
                      cmTargetExport *tei,
                      cmGeneratorExpression::PreprocessContext preprocessRule,
                      ImportPropertyMap &properties,
                      std::vector<std::string> &missingTargets)
{
  cmTarget *target = tei->Target;
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char *propName = "INTERFACE_INCLUDE_DIRECTORIES";
  const char *input = target->GetProperty(propName);

  cmGeneratorExpression ge;

  std::string dirs = cmGeneratorExpression::Preprocess(
                                            tei->InterfaceIncludeDirectories,
                                            preprocessRule,
                                            true);
  this->ReplaceInstallPrefix(dirs);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(dirs);
  std::string exportDirs = cge->Evaluate(target->GetMakefile(), "",
                                         false, target);

  if (cge->GetHadContextSensitiveCondition())
    {
    cmMakefile* mf = target->GetMakefile();
    std::ostringstream e;
    e << "Target \"" << target->GetName() << "\" is installed with "
    "INCLUDES DESTINATION set to a context sensitive path.  Paths which "
    "depend on the configuration, policy values or the link interface are "
    "not supported.  Consider using target_include_directories instead.";
    mf->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }

  if (!input && exportDirs.empty())
    {
    return;
    }
  if ((input && !*input) && exportDirs.empty())
    {
    // Set to empty
    properties[propName] = "";
    return;
    }

  prefixItems(exportDirs);

  std::string includes = (input?input:"");
  const char* sep = input ? ";" : "";
  includes += sep + exportDirs;
  std::string prepro = cmGeneratorExpression::Preprocess(includes,
                                                         preprocessRule,
                                                         true);
  if (!prepro.empty())
    {
    this->ResolveTargetsInGeneratorExpressions(prepro, target,
                                                missingTargets);

    if (!checkInterfaceDirs(prepro, target, propName))
      {
      return;
      }
    properties[propName] = prepro;
    }
}